

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_constraints.cpp
# Opt level: O3

void duckdb::ExtractReferencedColumns
               (ParsedExpression *expr,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *result)

{
  ColumnRefExpression *this;
  string *__x;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  if ((expr->super_BaseExpression).expression_class == COLUMN_REF) {
    this = BaseExpression::Cast<duckdb::ColumnRefExpression>(&expr->super_BaseExpression);
    __x = ColumnRefExpression::GetColumnName_abi_cxx11_(this);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)result,__x);
  }
  local_30._8_8_ = 0;
  local_18 = ::std::
             _Function_handler<void_(const_duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_constraints.cpp:133:12)>
             ::_M_invoke;
  local_20 = ::std::
             _Function_handler<void_(const_duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_constraints.cpp:133:12)>
             ::_M_manager;
  local_30._M_unused._M_object = result;
  ParsedExpressionIterator::EnumerateChildren
            (expr,(function<void_(const_duckdb::ParsedExpression_&)> *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return;
}

Assistant:

void ExtractReferencedColumns(const ParsedExpression &expr, vector<string> &result) {
	if (expr.GetExpressionClass() == ExpressionClass::COLUMN_REF) {
		auto &colref = expr.Cast<ColumnRefExpression>();
		result.push_back(colref.GetColumnName());
	}
	ParsedExpressionIterator::EnumerateChildren(
	    expr, [&](const ParsedExpression &child) { ExtractReferencedColumns(child, result); });
}